

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32_t field_number,FieldDescriptor *field,Message *message,
               CodedInputStream *input)

{
  Reflection *pRVar1;
  CodedInputStream *message_00;
  uint32_t field_number_00;
  bool bVar2;
  Type TVar3;
  UnknownFieldSet *unknown_fields;
  LogMessage *pLVar4;
  MessageFactory *factory;
  Message *pMVar5;
  Message *sub_message;
  LogMessage local_48;
  Voidify local_31;
  Reflection *local_30;
  Reflection *message_reflection;
  CodedInputStream *input_local;
  Message *message_local;
  FieldDescriptor *field_local;
  uint32_t field_number_local;
  
  message_reflection = (Reflection *)input;
  input_local = (CodedInputStream *)message;
  message_local = (Message *)field;
  field_local._0_4_ = field_number;
  local_30 = Message::GetReflection(message);
  field_number_00 = (uint32_t)field_local;
  pRVar1 = message_reflection;
  if (message_local == (Message *)0x0) {
    unknown_fields = Reflection::MutableUnknownFields(local_30,(Message *)input_local);
    field_local._7_1_ =
         SkipMessageSetField((CodedInputStream *)pRVar1,field_number_00,unknown_fields);
  }
  else {
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if ((!bVar2) &&
       (TVar3 = FieldDescriptor::type((FieldDescriptor *)message_local), pMVar5 = message_local,
       message_00 = input_local, pRVar1 = local_30, TVar3 == TYPE_MESSAGE)) {
      factory = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      pMVar5 = Reflection::MutableMessage
                         (pRVar1,(Message *)message_00,(FieldDescriptor *)pMVar5,factory);
      bVar2 = WireFormatLite::ReadMessage<google::protobuf::Message>
                        ((CodedInputStream *)message_reflection,pMVar5);
      return bVar2;
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x169);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [53])"Extensions of MessageSets must be optional messages."
                       );
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar4);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_48);
    field_local._7_1_ = false;
  }
  return field_local._7_1_;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32_t field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == nullptr) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    ABSL_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}